

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O1

GLuint __thiscall
glcts::anon_unknown_0::ShaderImageLoadStoreBase::BuildShaderProgram
          (ShaderImageLoadStoreBase *this,GLenum type,char *src)

{
  GLuint program;
  CallLogWrapper *this_00;
  GLint status;
  char *src3 [3];
  GLchar log [1024];
  int local_43c;
  char *local_438;
  char *local_430;
  char *local_428;
  GLchar local_418 [1024];
  
  local_438 = "#version 310 es";
  local_430 = 
  "\nprecision highp float;\nprecision highp int;\nprecision highp sampler2D;\nprecision highp sampler3D;\nprecision highp samplerCube;\nprecision highp sampler2DArray;\nprecision highp isampler2D;\nprecision highp isampler3D;\nprecision highp isamplerCube;\nprecision highp isampler2DArray;\nprecision highp usampler2D;\nprecision highp usampler3D;\nprecision highp usamplerCube;\nprecision highp usampler2DArray;\nprecision highp image2D;\nprecision highp image3D;\nprecision highp imageCube;\nprecision highp image2DArray;\nprecision highp iimage2D;\nprecision highp iimage3D;\nprecision highp iimageCube;\nprecision highp iimage2DArray;\nprecision highp uimage2D;\nprecision highp uimage3D;\nprecision highp uimageCube;\nprecision highp uimage2DArray;"
  ;
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  local_428 = src;
  program = glu::CallLogWrapper::glCreateShaderProgramv(this_00,type,3,&local_438);
  glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b82,&local_43c);
  if (local_43c == 0) {
    glu::CallLogWrapper::glGetProgramInfoLog(this_00,program,0x400,(GLsizei *)0x0,local_418);
    anon_unknown_0::Output
              ("Program Info Log:\n%s\n%s\n%s\n%s\n",local_418,local_438,local_430,local_428);
  }
  return program;
}

Assistant:

GLuint BuildShaderProgram(GLenum type, const char* src)
	{
		const char* const src3[3] = { kGLSLVer, kGLSLPrec, src };
		const GLuint	  p		  = glCreateShaderProgramv(type, 3, src3);
		GLint			  status;
		glGetProgramiv(p, GL_LINK_STATUS, &status);
		if (status == GL_FALSE)
		{
			GLchar log[1024];
			glGetProgramInfoLog(p, sizeof(log), NULL, log);
			Output("Program Info Log:\n%s\n%s\n%s\n%s\n", log, src3[0], src3[1], src3[2]);
		}
		return p;
	}